

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdPerformReplace(char *pBuffer,int PosStart,int Pos,int Symb,char *pNext)

{
  int iVar1;
  char *pcVar2;
  int i;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar2 = Dau_DsdPerformReplace::pTemp;
  lVar3 = (long)PosStart;
  for (lVar4 = lVar3; lVar4 < Pos; lVar4 = lVar4 + 1) {
    pcVar5 = pNext;
    if (pBuffer[lVar4] == Symb) {
      for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
        *pcVar2 = *pcVar5;
        pcVar2 = pcVar2 + 1;
      }
    }
    else {
      *pcVar2 = pBuffer[lVar4];
      pcVar2 = pcVar2 + 1;
    }
  }
  iVar1 = (int)pcVar2 + -0xcb8580 + PosStart;
  for (lVar4 = 0; lVar3 + lVar4 < (long)iVar1; lVar4 = lVar4 + 1) {
    pBuffer[lVar4 + lVar3] = Dau_DsdPerformReplace::pTemp[lVar4];
  }
  return iVar1;
}

Assistant:

static inline int Dau_DsdPerformReplace( char * pBuffer, int PosStart, int Pos, int Symb, char * pNext )
{
    static char pTemp[DAU_MAX_STR];
    char * pCur = pTemp;
    int i, k, RetValue;
    for ( i = PosStart; i < Pos; i++ )
        if ( pBuffer[i] != Symb )
            *pCur++ = pBuffer[i];
        else
            for ( k = 0; pNext[k]; k++ )
                *pCur++ = pNext[k];
    RetValue = PosStart + (pCur - pTemp);
    for ( i = PosStart; i < RetValue; i++ )
        pBuffer[i] = pTemp[i-PosStart];
    return RetValue;
}